

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall Logger::flush(Logger *this)

{
  FILE *__stream;
  allocator<char> local_49;
  char *local_48 [4];
  
  __stream = _stderr;
  if (((int)enabled_level <= (int)this->m_level) && (this->m_empty == false)) {
    std::__cxx11::stringbuf::str();
    fputs(local_48[0],__stream);
    std::__cxx11::string::~string((string *)local_48);
    fflush(_stderr);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"",&local_49);
    std::__cxx11::stringbuf::str((string *)&this->field_0x18);
    std::__cxx11::string::~string((string *)local_48);
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->os + -0x18) + (int)&this->os);
    std::ostream::seekp(&this->os,0,0);
    this->m_empty = true;
  }
  return;
}

Assistant:

void Logger::flush() {
    if ((m_level >= enabled_level) && !m_empty) {
        fprintf(stderr, "%s", os.str().c_str());
        fflush(stderr);
        os.str("");
        os.clear();
        os.seekp(0);
        m_empty = true;
    }
}